

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

int AF_A_Raise(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  player_t *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  DPSprite *this_01;
  undefined4 extraout_var;
  char *__assertion;
  DObject *this_02;
  double dVar5;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004c7bc4;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_02 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_02 == (DObject *)0x0) {
LAB_004c7a91:
        bVar2 = true;
        this_02 = (DObject *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf(this_02,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004c7bc4;
        }
        bVar2 = false;
      }
      if (numparam == 1) goto LAB_004c7b11;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_004c7ba2;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_004c7bc4;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_004c7ba2;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_004c7b11:
        if ((!bVar2) &&
           (this_00 = *(player_t **)&this_02[0xc].ObjectFlags, this_00 != (player_t *)0x0)) {
          if (this_00->PendingWeapon == (AWeapon *)0xffffffffffffffff) {
            if (this_00->ReadyWeapon != (AWeapon *)0x0) {
              this_01 = player_t::GetPSprite(this_00,PSP_WEAPON);
              dVar5 = this_01->y + -6.0;
              this_01->y = dVar5;
              if (dVar5 <= 32.375) {
                this_01->y = 32.375;
                iVar4 = (*(this_00->ReadyWeapon->super_AInventory).super_AActor.super_DThinker.
                          super_DObject._vptr_DObject[0x46])();
                DPSprite::SetState(this_01,(FState *)CONCAT44(extraout_var,iVar4),false);
              }
            }
          }
          else {
            P_DropWeapon(this_00);
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_004c7bc4;
    }
    if (this_02 == (DObject *)0x0) goto LAB_004c7a91;
  }
LAB_004c7ba2:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004c7bc4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x452,"int AF_A_Raise(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AInventory, A_Raise)
{
	PARAM_ACTION_PROLOGUE;

	if (self == nullptr)
	{
		return 0;
	}
	player_t *player = self->player;
	DPSprite *psp;

	if (nullptr == player)
	{
		return 0;
	}
	if (player->PendingWeapon != WP_NOCHANGE)
	{
		P_DropWeapon(player);
		return 0;
	}
	if (player->ReadyWeapon == nullptr)
	{
		return 0;
	}
	psp = player->GetPSprite(PSP_WEAPON);
	psp->y -= RAISESPEED;
	if (psp->y > WEAPONTOP)
	{ // Not raised all the way yet
		return 0;
	}
	psp->y = WEAPONTOP;
	psp->SetState(player->ReadyWeapon->GetReadyState());
	return 0;
}